

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamSample.hpp
# Opt level: O0

DreamPDF *
TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>
          (DreamPDF *__return_storage_ptr__,DreamModel *model,DreamLikelihood *likelihood,
          DreamPrior *prior)

{
  anon_class_96_3_eb0ebe5f local_88;
  DreamPrior *local_28;
  DreamPrior *prior_local;
  DreamLikelihood *likelihood_local;
  DreamModel *model_local;
  
  local_28 = prior;
  prior_local = likelihood;
  likelihood_local = (DreamLikelihood *)model;
  model_local = __return_storage_ptr__;
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_88.model,model);
  std::
  function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_88.likelihood,likelihood);
  std::
  function<void_(TasDREAM::TypeSamplingForm,_const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function(&local_88.prior,prior);
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::
  function<TasDREAM::posterior<(TasDREAM::TypeSamplingForm)1>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>)::_lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)_1_,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)__return_storage_ptr__,&local_88);
  posterior<(TasDREAM::TypeSamplingForm)1>(std::function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>,std::function<void(TasDREAM::TypeSamplingForm,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>)
  ::
  {lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)#1}
  ::~function((_lambda_std__vector<double,std::allocator<double>>const__std__vector<double,std::allocator<double>>___1_
               *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

DreamPDF posterior(DreamModel model,
          DreamLikelihood likelihood,
          DreamPrior prior){
    return [=](const std::vector<double> &candidates, std::vector<double> &values)->void{
        std::vector<double> model_outs;
        model(candidates, model_outs);
        likelihood(form, model_outs, values);

        std::vector<double> prior_vals(values.size());
        prior(form, candidates, prior_vals);

        auto iv = values.begin();
        if (form == regform){
            for(auto p : prior_vals) *iv++ *= p;
        }else{
            for(auto p : prior_vals) *iv++ += p;
        }
    };
}